

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

bit_cost_t __thiscall
lzham::lzcompressor::state::get_len2_match_cost
          (state *this,CLZBase *lzbase,uint dict_pos,uint len2_match_dist,uint is_match_model_index)

{
  uint bits;
  bit_cost_t bVar1;
  uint in_ECX;
  CLZBase *in_RSI;
  quasi_adaptive_huffman_data_model *in_RDI;
  uint in_R8D;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  uint match_low_sym;
  uint match_len;
  uint match_extra;
  uint match_slot;
  bit_cost_t cost;
  uint in_stack_ffffffffffffffac;
  uint local_30;
  uint local_2c;
  bit_cost_t local_28;
  uint local_18;
  CLZBase *local_10;
  
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_28 = adaptive_bit_model::get_cost
                       ((adaptive_bit_model *)(in_RDI + (ulong)in_R8D * 2 + 0x24),1);
  bVar1 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)(in_RDI + (ulong)*(uint *)(in_RDI + 4) * 2 + 0x3c),0);
  local_28 = bVar1 + local_28;
  CLZBase::compute_lzx_position_slot(local_10,local_18,&local_2c,&local_30);
  bVar1 = quasi_adaptive_huffman_data_model::get_cost(in_RDI,in_stack_ffffffffffffffac);
  local_28 = bVar1 + local_28;
  bits = (uint)*(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_2c);
  if (bits < 3) {
    bVar1 = convert_to_scaled_bitcost(bits);
    local_28 = bVar1 + local_28;
  }
  else {
    if (4 < bits) {
      bVar1 = convert_to_scaled_bitcost(bits - 4);
      local_28 = bVar1 + local_28;
    }
    bVar1 = quasi_adaptive_huffman_data_model::get_cost(in_RDI,in_stack_ffffffffffffffac);
    local_28 = bVar1 + local_28;
  }
  return local_28;
}

Assistant:

bit_cost_t lzcompressor::state::get_len2_match_cost(CLZBase& lzbase, uint dict_pos, uint len2_match_dist, uint is_match_model_index)
   {
      LZHAM_NOTE_UNUSED(dict_pos);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      // full match
      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(len2_match_dist, match_slot, match_extra);

      const uint match_len = 2;
      uint match_low_sym = match_len - 2;

      uint match_high_sym = 0;

      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
      match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      uint main_sym = match_low_sym | (match_high_sym << 3);

      cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      return cost;
   }